

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O1

int Sfm_NtkPerform(Sfm_Ntk_t *p,Sfm_Par_t *pPars)

{
  uint uVar1;
  Vec_Str_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTotal = lVar7;
  if (pPars->fVerbose != 0) {
    pVVar2 = p->vFixed;
    uVar9 = 0;
    if ((pVVar2 != (Vec_Str_t *)0x0) && (0 < (long)pVVar2->nSize)) {
      lVar7 = 0;
      uVar9 = 0;
      do {
        uVar9 = (ulong)(uint)((int)uVar9 + (int)pVVar2->pArray[lVar7]);
        lVar7 = lVar7 + 1;
      } while (pVVar2->nSize != lVar7);
    }
    pVVar2 = p->vEmpty;
    iVar3 = 0;
    if ((pVVar2 != (Vec_Str_t *)0x0) && (iVar3 = 0, 0 < (long)pVVar2->nSize)) {
      lVar7 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + pVVar2->pArray[lVar7];
        lVar7 = lVar7 + 1;
      } while (pVVar2->nSize != lVar7);
    }
    printf("Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n",
           (ulong)(uint)p->nPis,(ulong)(uint)p->nPos,(ulong)(uint)p->nNodes,
           (ulong)(uint)(p->nNodes - (int)uVar9),uVar9,iVar3);
  }
  p->pPars = pPars;
  Sfm_NtkPrepare(p);
  uVar6 = p->nPis;
  iVar3 = p->nPos;
  uVar1 = (p->vFanins).nSize;
  iVar5 = 0;
  iVar10 = 0;
  if ((int)uVar6 < (int)(uVar1 - iVar3)) {
    if ((int)uVar6 < 0) goto LAB_0051bd5d;
    uVar8 = uVar1;
    if ((int)uVar1 < (int)uVar6) {
      uVar8 = uVar6;
    }
    uVar9 = (ulong)uVar6 << 4 | 4;
    iVar10 = 0;
    uVar11 = uVar6;
    do {
      if (uVar8 - uVar6 <= (~uVar6 + uVar1) - iVar3) goto LAB_0051bd5d;
      iVar10 = iVar10 + (uint)(0 < *(int *)((long)&((p->vFanins).pArray)->nCap + uVar9));
      uVar11 = uVar11 + 1;
      uVar9 = uVar9 + 0x10;
    } while ((int)uVar11 < (int)(uVar1 - iVar3));
  }
  p->nTotalNodesBeg = iVar10;
  if (0 < (int)uVar1) {
    lVar7 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + *(int *)((long)&((p->vFanins).pArray)->nSize + lVar7);
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar7);
  }
  p->nTotalEdgesBeg = iVar5 - iVar3;
  iVar5 = 0;
  iVar3 = 0;
  if ((int)(p->nPos + uVar6) < p->nObjs) {
    uVar9 = (ulong)uVar6;
    iVar3 = 0;
    do {
      if ((int)uVar6 < 0) {
LAB_0051bd7c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      iVar10 = (int)uVar9;
      if (p->vFixed->nSize <= iVar10) goto LAB_0051bd7c;
      if (p->vFixed->pArray[uVar9] == '\0') {
        iVar12 = p->pPars->nDepthMax;
        if (iVar12 != 0) {
          if ((p->vLevels).nSize <= iVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (iVar12 < (p->vLevels).pArray[uVar9]) goto LAB_0051bbce;
        }
        if ((p->vFanins).nSize <= iVar10) goto LAB_0051bd5d;
        if (0xfffffffa < (p->vFanins).pArray[uVar9].nSize - 7U) {
          iVar12 = 1;
          do {
            iVar4 = Sfm_NodeResub(p,iVar10);
            iVar12 = iVar12 + -1;
          } while (iVar4 != 0);
          iVar3 = (iVar3 + 1) - (uint)(iVar12 == 0);
          if ((pPars->nNodesMax != 0) && (pPars->nNodesMax <= iVar3)) break;
        }
      }
LAB_0051bbce:
      uVar9 = uVar9 + 1;
    } while (p->nPos + (int)uVar9 < p->nObjs);
  }
  uVar6 = p->nPis;
  iVar10 = p->nPos;
  uVar1 = (p->vFanins).nSize;
  if ((int)uVar6 < (int)(uVar1 - iVar10)) {
    if ((int)uVar6 < 0) {
LAB_0051bd5d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    uVar8 = uVar1;
    if ((int)uVar1 < (int)uVar6) {
      uVar8 = uVar6;
    }
    uVar8 = uVar8 - uVar6;
    uVar11 = ~uVar6;
    uVar9 = (ulong)uVar6 << 4 | 4;
    iVar5 = 0;
    do {
      if (uVar8 <= (uVar11 + uVar1) - iVar10) goto LAB_0051bd5d;
      iVar5 = iVar5 + (uint)(0 < *(int *)((long)&((p->vFanins).pArray)->nCap + uVar9));
      uVar6 = uVar6 + 1;
      uVar9 = uVar9 + 0x10;
    } while ((int)uVar6 < (int)(uVar1 - iVar10));
  }
  p->nTotalNodesEnd = iVar5;
  if ((int)uVar1 < 1) {
    iVar5 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + *(int *)((long)&((p->vFanins).pArray)->nSize + lVar7);
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar7);
  }
  p->nTotalEdgesEnd = iVar5 - iVar10;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTotal = lVar7 - p->timeTotal;
  if (pPars->fVerbose != 0) {
    Sfm_NtkPrintStats(p);
  }
  return iVar3;
}

Assistant:

int Sfm_NtkPerform( Sfm_Ntk_t * p, Sfm_Par_t * pPars )
{
    int i, k, Counter = 0;
    //Sfm_NtkPrint( p );
    p->timeTotal = Abc_Clock();
    if ( pPars->fVerbose )
    {
        int nFixed = p->vFixed ? Vec_StrSum(p->vFixed) : 0;
        int nEmpty = p->vEmpty ? Vec_StrSum(p->vEmpty) : 0;
        printf( "Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n", 
            p->nPis, p->nPos, p->nNodes, p->nNodes-nFixed, nFixed, nEmpty );
    }
    p->pPars = pPars;
    Sfm_NtkPrepare( p );
//    Sfm_ComputeInterpolantCheck( p );
//    return 0;
    p->nTotalNodesBeg = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesBeg = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    Sfm_NtkForEachNode( p, i )
    {
        if ( Sfm_ObjIsFixed( p, i ) )
            continue;
        if ( p->pPars->nDepthMax && Sfm_ObjLevel(p, i) > p->pPars->nDepthMax )
            continue;
        if ( Sfm_ObjFaninNum(p, i) < 2 || Sfm_ObjFaninNum(p, i) > 6 )
            continue;
        for ( k = 0; Sfm_NodeResub(p, i); k++ )
        {
//            Counter++;
//            break;
        }
        Counter += (k > 0);
        if ( pPars->nNodesMax && Counter >= pPars->nNodesMax )
            break;
    }
    p->nTotalNodesEnd = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesEnd = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
        Sfm_NtkPrintStats( p );
    //Sfm_NtkPrint( p );
    return Counter;
}